

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

Dec_Graph_t *
Rwr_CutEvaluate(Rwr_Man_t *p,Abc_Obj_t *pRoot,Cut_Cut_t *pCut,Vec_Ptr_t *vFaninsCur,int nNodesSaved,
               int LevelMax,int *pGainBest,int fPlaceEnable)

{
  Dec_Graph_t *pGraph;
  int iVar1;
  uint *puVar2;
  Vec_Ptr_t *p_00;
  void *pvVar3;
  void *pvVar4;
  Dec_Node_t *pDVar5;
  float CostBest;
  uint uTruth;
  int k;
  int i;
  int GainBest;
  int nNodesAdded;
  Rwr_Node_t *pFanin;
  Rwr_Node_t *pNode;
  Dec_Graph_t *pGraphCur;
  Dec_Graph_t *pGraphBest;
  Vec_Ptr_t *vSubgraphs;
  int LevelMax_local;
  int nNodesSaved_local;
  Vec_Ptr_t *vFaninsCur_local;
  Cut_Cut_t *pCut_local;
  Abc_Obj_t *pRoot_local;
  Rwr_Man_t *p_local;
  
  pGraphCur = (Dec_Graph_t *)0x0;
  puVar2 = Cut_CutReadTruth(pCut);
  p_00 = Vec_VecEntry(p->vClasses,(uint)p->pMap[*puVar2 & 0xffff]);
  p->nSubgraphs = p_00->nSize + p->nSubgraphs;
  k = -1;
  uTruth = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= (int)uTruth) {
      if (k == -1) {
        p_local = (Rwr_Man_t *)0x0;
      }
      else {
        *pGainBest = k;
        p_local = (Rwr_Man_t *)pGraphCur;
      }
      return (Dec_Graph_t *)p_local;
    }
    pvVar3 = Vec_PtrEntry(p_00,uTruth);
    pGraph = *(Dec_Graph_t **)((long)pvVar3 + 0x28);
    for (CostBest = 0.0; iVar1 = Vec_PtrSize(vFaninsCur), (int)CostBest < iVar1;
        CostBest = (float)((int)CostBest + 1)) {
      pvVar4 = Vec_PtrEntry(vFaninsCur,(int)CostBest);
      pDVar5 = Dec_GraphNode(pGraph,(int)CostBest);
      (pDVar5->field_2).pFunc = pvVar4;
    }
    iVar1 = Dec_GraphToNetworkCount(pRoot,pGraph,nNodesSaved,LevelMax);
    if (iVar1 != -1) {
      if (nNodesSaved < iVar1) {
        __assert_fail("nNodesSaved >= nNodesAdded",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrEva.c"
                      ,0x119,
                      "Dec_Graph_t *Rwr_CutEvaluate(Rwr_Man_t *, Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *, int, int, int *, int)"
                     );
      }
      if ((k < nNodesSaved - iVar1) &&
         (k = nNodesSaved - iVar1, pGraphCur = pGraph, 0 < nNodesSaved - iVar1)) {
        *(short *)((long)pvVar3 + 8) = *(short *)((long)pvVar3 + 8) + 1;
        *(short *)((long)pvVar3 + 10) = *(short *)((long)pvVar3 + 10) + (short)k;
        *(short *)((long)pvVar3 + 0xc) = *(short *)((long)pvVar3 + 0xc) + (short)iVar1;
      }
    }
    uTruth = uTruth + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Rwr_CutEvaluate( Rwr_Man_t * p, Abc_Obj_t * pRoot, Cut_Cut_t * pCut, Vec_Ptr_t * vFaninsCur, int nNodesSaved, int LevelMax, int * pGainBest, int fPlaceEnable )
{
    extern int            Dec_GraphToNetworkCount( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax );
    Vec_Ptr_t * vSubgraphs;
    Dec_Graph_t * pGraphBest = NULL; // Suppress "might be used uninitialized"
    Dec_Graph_t * pGraphCur;
    Rwr_Node_t * pNode, * pFanin;
    int nNodesAdded, GainBest, i, k;
    unsigned uTruth;
    float CostBest;//, CostCur;
    // find the matching class of subgraphs
    uTruth = 0xFFFF & *Cut_CutReadTruth(pCut);
    vSubgraphs = Vec_VecEntry( p->vClasses, p->pMap[uTruth] );
    p->nSubgraphs += vSubgraphs->nSize;
    // determine the best subgraph
    GainBest = -1;
    CostBest = ABC_INFINITY;
    Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, i )
    {
        // get the current graph
        pGraphCur = (Dec_Graph_t *)pNode->pNext;
        // copy the leaves
        Vec_PtrForEachEntry( Rwr_Node_t *, vFaninsCur, pFanin, k )
            Dec_GraphNode(pGraphCur, k)->pFunc = pFanin;
        // detect how many unlabeled nodes will be reused
        nNodesAdded = Dec_GraphToNetworkCount( pRoot, pGraphCur, nNodesSaved, LevelMax );
        if ( nNodesAdded == -1 )
            continue;
        assert( nNodesSaved >= nNodesAdded );
/*
        // evaluate the cut
        if ( fPlaceEnable )
        {
            extern float Abc_PlaceEvaluateCut( Abc_Obj_t * pRoot, Vec_Ptr_t * vFanins );

            float Alpha = 0.5; // ???
            float PlaceCost;

            // get the placement cost of the cut
            PlaceCost = Abc_PlaceEvaluateCut( pRoot, vFaninsCur );

            // get the weigted cost of the cut
            CostCur = nNodesSaved - nNodesAdded + Alpha * PlaceCost;

            // do not allow uphill moves
            if ( nNodesSaved - nNodesAdded < 0 )
                continue;

            // decide what cut to use
            if ( CostBest > CostCur )
            {
                GainBest   = nNodesSaved - nNodesAdded; // pure node cost
                CostBest   = CostCur;                   // cost with placement
                pGraphBest = pGraphCur;                 // subgraph to be used for rewriting

                // score the graph
                if ( nNodesSaved - nNodesAdded > 0 )
                {
                    pNode->nScore++;
                    pNode->nGain += GainBest;
                    pNode->nAdded += nNodesAdded;
                }
            }
        }
        else
*/
        {
            // count the gain at this node
            if ( GainBest < nNodesSaved - nNodesAdded )
            {
                GainBest   = nNodesSaved - nNodesAdded;
                pGraphBest = pGraphCur;

                // score the graph
                if ( nNodesSaved - nNodesAdded > 0 )
                {
                    pNode->nScore++;
                    pNode->nGain += GainBest;
                    pNode->nAdded += nNodesAdded;
                }
            }
        }
    }
    if ( GainBest == -1 )
        return NULL;
    *pGainBest = GainBest;
    return pGraphBest;
}